

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<float,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  bool bVar1;
  float fVar2;
  float *pfVar3;
  byte bVar4;
  float *pfVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = *(uint *)&this->num_components_;
  bVar4 = out_num_components;
  if ((byte)uVar7 < out_num_components) {
    bVar4 = (byte)uVar7;
  }
  bVar8 = bVar4 == 0;
  if (bVar8) {
LAB_00162c20:
    if ((byte)uVar7 < out_num_components) {
      memset(out_value + (uVar7 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar7 & 0xff)) * 8 + 8);
    }
  }
  else {
    pfVar5 = (float *)((this->buffer_->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start +
                      this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    pfVar3 = (float *)(this->buffer_->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    if (pfVar5 < pfVar3) {
      bVar1 = this->normalized_;
      uVar6 = 1;
      do {
        fVar2 = *pfVar5;
        if (9.223372e+18 <= fVar2) {
          return bVar8;
        }
        if ((bVar1 & 1U) != 0) {
          return bVar8;
        }
        if (fVar2 < -9.223372e+18) {
          return bVar8;
        }
        if (0x7f7fffff < (uint)ABS(fVar2)) {
          return bVar8;
        }
        out_value[uVar6 - 1] = (long)fVar2;
        uVar7 = *(uint *)&this->num_components_;
        bVar4 = (byte)uVar7;
        if (out_num_components <= (byte)uVar7) {
          bVar4 = out_num_components;
        }
        bVar8 = bVar4 <= uVar6;
        if (bVar8) goto LAB_00162c20;
        pfVar5 = pfVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (pfVar5 < pfVar3);
    }
  }
  return bVar8;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }